

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:5219:13)>
::getImpl(SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:5219:13)>
          *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  WebSocket *pWVar2;
  ExceptionOr<kj::HttpClient::WebSocketResponse> depResult;
  OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>
  local_3c8;
  ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_> local_3a8;
  ExceptionOrValue local_200;
  char local_68;
  OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>
  local_40;
  
  local_200.exception.ptr.isSet = false;
  local_68 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_200);
  if (local_200.exception.ptr.isSet == true) {
    local_3a8.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_200.exception.ptr.field_1.value.ownFile.content.ptr;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_200.exception.ptr.field_1.value.ownFile.content.size_;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_200.exception.ptr.field_1.value.ownFile.content.disposer;
    local_200.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_200.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_200.exception.ptr.field_1.value.file;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_200.exception.ptr.field_1._32_8_;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_200.exception.ptr.field_1.value.description.content.ptr;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_200.exception.ptr.field_1.value.description.content.size_;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_200.exception.ptr.field_1.value.description.content.disposer;
    local_200.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_200.exception.ptr.field_1.value.description.content.size_ = 0;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_200.exception.ptr.field_1.value.context.ptr.disposer;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         local_200.exception.ptr.field_1.value.context.ptr.ptr;
    local_200.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_200.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_200.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_200.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_200.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_200.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_3a8.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_200.exception.ptr.field_1 + 0x68),0x105);
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_200.exception.ptr.field_1.value.details.builder.ptr;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_200.exception.ptr.field_1.value.details.builder.pos;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_200.exception.ptr.field_1.value.details.builder.endPtr;
    local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_200.exception.ptr.field_1.value.details.builder.disposer;
    local_200.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_200.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_200.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_3a8.value.ptr.disposer = (Disposer *)0x0;
    local_3a8.value.ptr.ptr = (WebSocket *)0x0;
    ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_>::operator=
              ((ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_> *)output,&local_3a8);
    pWVar2 = local_3a8.value.ptr.ptr;
    if (local_3a8.value.ptr.ptr != (WebSocket *)0x0) {
      local_3a8.value.ptr.ptr = (WebSocket *)0x0;
      (**(local_3a8.value.ptr.disposer)->_vptr_Disposer)
                (local_3a8.value.ptr.disposer,
                 (_func_int *)((long)&pWVar2->_vptr_WebSocket + (long)pWVar2->_vptr_WebSocket[-2]));
    }
  }
  else {
    if (local_68 != '\x01') goto LAB_00339e4f;
    local_3c8.tag = local_40.tag;
    if (local_40.tag - 1 < 2) {
      local_3c8.field_1._0_8_ = local_40.field_1._0_8_;
      local_3c8.field_1._8_8_ = local_40.field_1._8_8_;
      local_40.field_1._8_8_ = (WebSocket *)0x0;
    }
    uVar1 = local_3c8.field_1._8_8_;
    local_3c8.field_1._8_8_ = (WebSocket *)0x0;
    OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>::
    destroy(&local_3c8);
    local_3a8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_3a8.value.ptr.disposer = (Disposer *)local_3c8.field_1._0_8_;
    local_3a8.value.ptr.ptr = (WebSocket *)uVar1;
    ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_>::operator=
              ((ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_> *)output,&local_3a8);
    pWVar2 = local_3a8.value.ptr.ptr;
    if (local_3a8.value.ptr.ptr != (WebSocket *)0x0) {
      local_3a8.value.ptr.ptr = (WebSocket *)0x0;
      (**(local_3a8.value.ptr.disposer)->_vptr_Disposer)
                (local_3a8.value.ptr.disposer,
                 (_func_int *)((long)&pWVar2->_vptr_WebSocket + (long)pWVar2->_vptr_WebSocket[-2]));
    }
  }
  if (local_3a8.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_3a8.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_00339e4f:
  if (local_68 == '\x01') {
    OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>::
    destroy(&local_40);
  }
  if (local_200.exception.ptr.isSet == true) {
    Exception::~Exception(&local_200.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }